

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.h
# Opt level: O3

void DrawerCommandQueue::QueueCommand<swrenderer::DrawSpanMaskedAddClampPalCommand>(void)

{
  pointer *pppDVar1;
  iterator __position;
  DrawerCommandQueue *this;
  PalSpanCommand *this_00;
  DrawSpanMaskedAddClampPalCommand command;
  PalSpanCommand local_78;
  
  this = Instance();
  if ((this->threaded_render == 0) || (r_multithreaded.Value == false)) {
    local_78._srcblend = (uint32_t *)0x0;
    local_78._destblend = (uint32_t *)0x0;
    local_78._xstep = 0;
    local_78._ystep = 0;
    local_78._xbits = 0;
    local_78._ybits = 0;
    local_78._x2 = 0;
    local_78._52_4_ = 0;
    local_78._destorg = (uint8_t *)0x0;
    local_78._xfrac = 0;
    local_78._yfrac = 0;
    local_78._y = 0;
    local_78._x1 = 0;
    local_78._source = (uint8_t *)0x0;
    local_78._colormap = (uint8_t *)0x0;
    local_78.super_DrawerCommand._vptr_DrawerCommand = (_func_int **)0x0;
    local_78.super_DrawerCommand._dest_y = 0;
    local_78.super_DrawerCommand._12_4_ = 0;
    local_78._color = 0;
    local_78._100_4_ = 0;
    swrenderer::PalSpanCommand::PalSpanCommand(&local_78);
    local_78.super_DrawerCommand._vptr_DrawerCommand = (_func_int **)&PTR__DrawerCommand_006eb808;
    VectoredTryCatch(&local_78,
                     QueueCommand<swrenderer::DrawSpanMaskedAddClampPalCommand>::
                     anon_class_1_0_00000001::__invoke,
                     QueueCommand<swrenderer::DrawSpanMaskedAddClampPalCommand>::
                     anon_class_1_0_00000001::__invoke);
  }
  else {
    this_00 = (PalSpanCommand *)AllocMemory(0x68);
    if (this_00 == (PalSpanCommand *)0x0) {
      Finish(this);
      this_00 = (PalSpanCommand *)AllocMemory(0x68);
      if (this_00 == (PalSpanCommand *)0x0) {
        return;
      }
    }
    this_00->_srcblend = (uint32_t *)0x0;
    this_00->_destblend = (uint32_t *)0x0;
    this_00->_xstep = 0;
    this_00->_ystep = 0;
    this_00->_xbits = 0;
    this_00->_ybits = 0;
    *(undefined8 *)&this_00->_x2 = 0;
    this_00->_destorg = (uint8_t *)0x0;
    this_00->_xfrac = 0;
    this_00->_yfrac = 0;
    this_00->_y = 0;
    this_00->_x1 = 0;
    this_00->_source = (uint8_t *)0x0;
    this_00->_colormap = (uint8_t *)0x0;
    (this_00->super_DrawerCommand)._vptr_DrawerCommand = (_func_int **)0x0;
    *(undefined8 *)&(this_00->super_DrawerCommand)._dest_y = 0;
    *(undefined8 *)&this_00->_color = 0;
    swrenderer::PalSpanCommand::PalSpanCommand(this_00);
    (this_00->super_DrawerCommand)._vptr_DrawerCommand = (_func_int **)&PTR__DrawerCommand_006eb808;
    __position._M_current =
         (this->commands).super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->commands).super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_78.super_DrawerCommand._vptr_DrawerCommand = (_func_int **)this_00;
      std::vector<DrawerCommand*,std::allocator<DrawerCommand*>>::_M_realloc_insert<DrawerCommand*>
                ((vector<DrawerCommand*,std::allocator<DrawerCommand*>> *)&this->commands,__position
                 ,(DrawerCommand **)&local_78);
    }
    else {
      *__position._M_current = &this_00->super_DrawerCommand;
      pppDVar1 = &(this->commands).
                  super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppDVar1 = *pppDVar1 + 1;
    }
  }
  return;
}

Assistant:

static void QueueCommand(Types &&... args)
	{
		auto queue = Instance();
		if (queue->threaded_render == 0 || !r_multithreaded)
		{
			T command(std::forward<Types>(args)...);
			VectoredTryCatch(&command,
			[](void *data)
			{
				T *c = (T*)data;
				c->Execute(&Instance()->single_core_thread);
			},
			[](void *data, const char *reason, bool fatal)
			{
				T *c = (T*)data;
				ReportDrawerError(c, false, reason, fatal);
			});
		}
		else
		{
			void *ptr = AllocMemory(sizeof(T));
			if (!ptr) // Out of memory - render what we got
			{
				queue->Finish();
				ptr = AllocMemory(sizeof(T));
				if (!ptr)
					return;
			}
			T *command = new (ptr)T(std::forward<Types>(args)...);
			queue->commands.push_back(command);
		}
	}